

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O0

void __thiscall
adios2::core::
Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~Attribute(Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  
  ~Attribute(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~Attribute() = default;